

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O1

bool QApplicationPrivate::updateTouchPointsForWidget(QWidget *widget,QTouchEvent *touchEvent)

{
  char cVar1;
  long *plVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  long in_FS_OFFSET;
  qreal in_XMM1_Qa;
  QPointF QVar6;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(touchEvent + 0x38) == 0) {
    bVar5 = false;
  }
  else {
    uVar3 = 0;
    bVar4 = false;
    do {
      plVar2 = (long *)QPointerEvent::point((longlong)touchEvent);
      local_48.xp = (qreal)QEventPoint::globalPosition();
      local_48.yp = in_XMM1_Qa;
      QVar6 = QWidget::mapFromGlobal(widget,&local_48);
      in_XMM1_Qa = QVar6.yp;
      *(QPointF *)(*plVar2 + 0x30) = QVar6;
      cVar1 = QEventPoint::state();
      bVar5 = true;
      if (cVar1 != '\x01') {
        bVar5 = bVar4;
      }
      uVar3 = uVar3 + 1;
      bVar4 = bVar5;
    } while (uVar3 < *(ulong *)(touchEvent + 0x38));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool QApplicationPrivate::updateTouchPointsForWidget(QWidget *widget, QTouchEvent *touchEvent)
{
    bool containsPress = false;

    for (int i = 0; i < touchEvent->pointCount(); ++i) {
        auto &pt = touchEvent->point(i);
        QMutableEventPoint::setPosition(pt, widget->mapFromGlobal(pt.globalPosition()));

        if (pt.state() == QEventPoint::State::Pressed)
            containsPress = true;
    }
    return containsPress;
}